

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::Address::Set
          (Error *__return_storage_ptr__,Address *this,sockaddr_storage *aSockAddr)

{
  char cVar1;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  string local_a0;
  undefined1 local_80 [40];
  format_string_checker<char> local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (aSockAddr->ss_family == 2) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
               aSockAddr->__ss_padding + 2,aSockAddr->__ss_padding + 6);
  }
  else if (aSockAddr->ss_family == 10) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
               aSockAddr->__ss_padding + 6,aSockAddr->__ss_padding + 0x16);
  }
  else {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "only AF_INET and AF_INET6 address families are supported";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x38;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    from = "only AF_INET and AF_INET6 address families are supported";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_00228160;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",&local_58);
    }
LAB_00228160:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"only AF_INET and AF_INET6 address families are supported",
               (string_view)ZEXT816(0x38),args);
    local_80._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
    Error::operator=(__return_storage_ptr__,(Error *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Address::Set(const sockaddr_storage &aSockAddr)
{
    Error error;

    VerifyOrExit(aSockAddr.ss_family == AF_INET || aSockAddr.ss_family == AF_INET6,
                 error = ERROR_INVALID_ARGS("only AF_INET and AF_INET6 address families are supported"));

    if (aSockAddr.ss_family == AF_INET)
    {
        auto &addr4 = *reinterpret_cast<const sockaddr_in *>(&aSockAddr);
        auto  raw   = reinterpret_cast<const uint8_t *>(&addr4.sin_addr);
        mBytes.assign(raw, raw + sizeof(addr4.sin_addr));
    }
    else
    {
        auto &addr6 = *reinterpret_cast<const sockaddr_in6 *>(&aSockAddr);
        auto  raw   = reinterpret_cast<const uint8_t *>(&addr6.sin6_addr);
        mBytes.assign(raw, raw + sizeof(addr6.sin6_addr));
    }

exit:
    return error;
}